

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall gui::MenuBarStyle::MenuBarStyle(MenuBarStyle *this,Gui *gui)

{
  Gui *in_RSI;
  Style *in_RDI;
  Vector2f *in_stack_ffffffffffffffa8;
  Style *size;
  RectangleShape *in_stack_ffffffffffffffb0;
  RectangleShape *this_00;
  Text *this_01;
  Vector2<float> local_34;
  Vector2<float> local_2c [2];
  Vector2<float> local_18 [3];
  
  Style::Style(in_RDI,in_RSI);
  in_RDI->_vptr_Style = (_func_int **)&PTR__MenuBarStyle_0047f8a0;
  this_01 = (Text *)(in_RDI + 1);
  sf::Vector2<float>::Vector2(local_18,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (RectangleShape *)&in_RDI[0x16].gui_;
  sf::Vector2<float>::Vector2(local_2c,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,in_stack_ffffffffffffffa8);
  size = in_RDI + 0x2c;
  sf::Vector2<float>::Vector2(&local_34,0.0,0.0);
  sf::RectangleShape::RectangleShape(this_00,(Vector2f *)size);
  sf::Text::Text(this_01);
  sf::Color::Color((Color *)&in_RDI[0x58].gui_);
  sf::Color::Color((Color *)((long)&in_RDI[0x58].gui_ + 4));
  sf::Color::Color((Color *)(in_RDI + 0x59));
  sf::Color::Color((Color *)((long)&in_RDI[0x59]._vptr_Style + 4));
  sf::Vector3<float>::Vector3((Vector3<float> *)&in_RDI[0x59].gui_);
  sf::Vector3<float>::Vector3((Vector3<float> *)((long)&in_RDI[0x5a]._vptr_Style + 4));
  return;
}

Assistant:

MenuBarStyle::MenuBarStyle(const Gui& gui) :
    Style(gui) {
}